

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_InternalKey_EncodeDecode::_Run(_Test_InternalKey_EncodeDecode *this)

{
  char *pcVar1;
  allocator local_f9;
  string local_f8 [55];
  allocator local_c1;
  string local_c0 [32];
  uint local_a0;
  uint local_9c;
  int s;
  int k;
  uint64_t seq [12];
  char *keys [4];
  _Test_InternalKey_EncodeDecode *this_local;
  
  seq[0xb] = (long)"==== Test %s.%s\n" + 0x10;
  memcpy(&s,&DAT_00115310,0x60);
  for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < 0xc; local_a0 = local_a0 + 1) {
      pcVar1 = (char *)seq[(long)(int)local_9c + 0xb];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
      TestKey((string *)local_c0,*(uint64_t *)(&s + (long)(int)local_a0 * 2),kTypeValue);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"hello",&local_f9);
      TestKey((string *)local_f8,1,kTypeDeletion);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
  }
  return;
}

Assistant:

TEST(FormatTest, InternalKey_EncodeDecode) {
  const char* keys[] = {"", "k", "hello", "longggggggggggggggggggggg"};
  const uint64_t seq[] = {1,
                          2,
                          3,
                          (1ull << 8) - 1,
                          1ull << 8,
                          (1ull << 8) + 1,
                          (1ull << 16) - 1,
                          1ull << 16,
                          (1ull << 16) + 1,
                          (1ull << 32) - 1,
                          1ull << 32,
                          (1ull << 32) + 1};
  for (int k = 0; k < sizeof(keys) / sizeof(keys[0]); k++) {
    for (int s = 0; s < sizeof(seq) / sizeof(seq[0]); s++) {
      TestKey(keys[k], seq[s], kTypeValue);
      TestKey("hello", 1, kTypeDeletion);
    }
  }
}